

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# floor1.c
# Opt level: O1

int * floor1_interpolate_fit(vorbis_block *vb,vorbis_look_floor1 *look,int *A,int *B,int del)

{
  int iVar1;
  int *piVar2;
  long lVar3;
  uint uVar4;
  
  if (B == (int *)0x0 || A == (int *)0x0) {
    piVar2 = (int *)0x0;
  }
  else {
    iVar1 = look->posts;
    piVar2 = (int *)_vorbis_block_alloc(vb,(long)iVar1 * 4);
    if (0 < iVar1) {
      lVar3 = 0;
      do {
        uVar4 = (int)((A[lVar3] & 0x7fffU) * (0x10000 - del) + (B[lVar3] & 0x7fffU) * del + 0x8000)
                >> 0x10;
        piVar2[lVar3] = uVar4;
        if (((*(byte *)((long)A + lVar3 * 4 + 1) & 0x80) != 0) &&
           ((*(byte *)((long)B + lVar3 * 4 + 1) & 0x80) != 0)) {
          piVar2[lVar3] = uVar4 | 0x8000;
        }
        lVar3 = lVar3 + 1;
      } while (iVar1 != lVar3);
    }
  }
  return piVar2;
}

Assistant:

int *floor1_interpolate_fit(vorbis_block *vb,vorbis_look_floor1 *look,
                          int *A,int *B,
                          int del){

  long i;
  long posts=look->posts;
  int *output=NULL;

  if(A && B){
    output=_vorbis_block_alloc(vb,sizeof(*output)*posts);

    /* overly simpleminded--- look again post 1.2 */
    for(i=0;i<posts;i++){
      output[i]=((65536-del)*(A[i]&0x7fff)+del*(B[i]&0x7fff)+32768)>>16;
      if(A[i]&0x8000 && B[i]&0x8000)output[i]|=0x8000;
    }
  }

  return(output);
}